

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

bool __thiscall
cmOrderDirectoriesConstraintLibrary::FindConflict
          (cmOrderDirectoriesConstraintLibrary *this,string *dir)

{
  string *name;
  cmOrderDirectories *pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  pointer __lhs;
  string ext;
  string lib;
  string fname;
  
  name = &(this->super_cmOrderDirectoriesConstraint).FileName;
  bVar3 = cmOrderDirectoriesConstraint::FileMayConflict
                    (&this->super_cmOrderDirectoriesConstraint,dir,name);
  bVar4 = true;
  if (!bVar3) {
    pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
    if (((pcVar1->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pcVar1->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar3 = cmsys::RegularExpression::find(&pcVar1->RemoveLibraryExtension,name), bVar3)) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&lib,&(((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension).
                       regmatch,1);
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&ext,&(((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension).
                       regmatch,2);
      pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
      pbVar2 = (pcVar1->LinkExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__lhs = (pcVar1->LinkExtensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar2; __lhs = __lhs + 1) {
        bVar3 = std::operator!=(__lhs,&ext);
        if (bVar3) {
          cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>(&fname,&lib,__lhs);
          bVar3 = cmOrderDirectoriesConstraint::FileMayConflict
                            (&this->super_cmOrderDirectoriesConstraint,dir,&fname);
          std::__cxx11::string::~string((string *)&fname);
          if (bVar3) {
            std::__cxx11::string::~string((string *)&ext);
            std::__cxx11::string::~string((string *)&lib);
            return true;
          }
        }
      }
      std::__cxx11::string::~string((string *)&ext);
      std::__cxx11::string::~string((string *)&lib);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmOrderDirectoriesConstraintLibrary::FindConflict(std::string const& dir)
{
  // We have the library file name.  Check if it will be found.
  if (this->FileMayConflict(dir, this->FileName)) {
    return true;
  }

  // Now check if the file exists with other extensions the linker
  // might consider.
  if (!this->OD->LinkExtensions.empty() &&
      this->OD->RemoveLibraryExtension.find(this->FileName)) {
    std::string lib = this->OD->RemoveLibraryExtension.match(1);
    std::string ext = this->OD->RemoveLibraryExtension.match(2);
    for (std::string const& LinkExtension : this->OD->LinkExtensions) {
      if (LinkExtension != ext) {
        std::string fname = cmStrCat(lib, LinkExtension);
        if (this->FileMayConflict(dir, fname)) {
          return true;
        }
      }
    }
  }
  return false;
}